

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  int iVar2;
  undefined4 uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar14;
  byte bVar15;
  AABBNodeMB4D *node1;
  undefined1 (*pauVar16) [32];
  long lVar17;
  long lVar18;
  byte bVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  byte bVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  size_t sVar35;
  ulong uVar36;
  ulong uVar37;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [64];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined4 uVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar87;
  float fVar88;
  undefined1 auVar86 [16];
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  UVIdentity<4> mapUV;
  undefined1 local_2688 [16];
  ulong local_2678;
  StackItemT<embree::NodeRefPtr<8>_> *local_2670;
  long local_2668;
  ulong local_2660;
  long local_2658;
  Scene *local_2650;
  RTCFilterFunctionNArguments args;
  undefined8 local_2618;
  undefined8 uStack_2610;
  undefined1 local_2608 [32];
  undefined1 local_25e8 [32];
  undefined1 local_25c8 [32];
  undefined1 local_25a8 [32];
  undefined1 local_2588 [32];
  undefined1 local_2568 [16];
  undefined1 local_2558 [16];
  undefined1 local_2548 [16];
  UVIdentity<4> *local_2538;
  byte local_2530;
  undefined1 local_2528 [16];
  undefined1 local_2518 [16];
  undefined1 local_2508 [16];
  undefined1 local_24f8 [16];
  undefined1 local_24e8 [16];
  float local_24d8 [4];
  undefined1 local_24c8 [16];
  undefined8 local_24b8;
  undefined8 uStack_24b0;
  RTCHitN local_24a8 [16];
  undefined1 local_2498 [16];
  undefined1 local_2488 [16];
  undefined1 local_2478 [16];
  undefined4 local_2468;
  undefined4 uStack_2464;
  undefined4 uStack_2460;
  undefined4 uStack_245c;
  undefined1 local_2458 [16];
  undefined1 local_2448 [16];
  uint local_2438;
  uint uStack_2434;
  uint uStack_2430;
  uint uStack_242c;
  uint uStack_2428;
  uint uStack_2424;
  uint uStack_2420;
  uint uStack_241c;
  undefined1 local_2418 [32];
  float local_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  float fStack_23e4;
  float fStack_23e0;
  float fStack_23dc;
  float local_23d8;
  float fStack_23d4;
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  float fStack_23c4;
  float fStack_23c0;
  float fStack_23bc;
  float local_23b8;
  float fStack_23b4;
  float fStack_23b0;
  float fStack_23ac;
  float fStack_23a8;
  float fStack_23a4;
  float fStack_23a0;
  float fStack_239c;
  float local_2398;
  float fStack_2394;
  float fStack_2390;
  float fStack_238c;
  float fStack_2388;
  float fStack_2384;
  float fStack_2380;
  float fStack_237c;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  local_2670 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  local_2588 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar110 = ZEXT3264(local_2588);
  local_25a8 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar111 = ZEXT3264(local_25a8);
  local_25c8 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar112 = ZEXT3264(local_25c8);
  fVar85 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar93 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar100 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_25e8 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar85 * 0.99999964)));
  auVar113 = ZEXT3264(local_25e8);
  local_2608 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar93 * 0.99999964)));
  auVar114 = ZEXT3264(local_2608);
  fVar78 = fVar100 * 0.99999964;
  fVar85 = fVar85 * 1.0000004;
  fVar93 = fVar93 * 1.0000004;
  fVar100 = fVar100 * 1.0000004;
  uVar30 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar23 = uVar30 ^ 0x20;
  iVar2 = (tray->tnear).field_0.i[k];
  local_2418._4_4_ = iVar2;
  local_2418._0_4_ = iVar2;
  local_2418._8_4_ = iVar2;
  local_2418._12_4_ = iVar2;
  local_2418._16_4_ = iVar2;
  local_2418._20_4_ = iVar2;
  local_2418._24_4_ = iVar2;
  local_2418._28_4_ = iVar2;
  auVar107 = ZEXT3264(local_2418);
  iVar2 = (tray->tfar).field_0.i[k];
  auVar70 = ZEXT3264(CONCAT428(iVar2,CONCAT424(iVar2,CONCAT420(iVar2,CONCAT416(iVar2,CONCAT412(iVar2
                                                  ,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))))))));
  local_24c8 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar108 = ZEXT3264(_DAT_01fe9900);
  auVar109 = ZEXT3264(CONCAT428(0xfffffff8,
                                CONCAT424(0xfffffff8,
                                          CONCAT420(0xfffffff8,
                                                    CONCAT416(0xfffffff8,
                                                              CONCAT412(0xfffffff8,
                                                                        CONCAT48(0xfffffff8,
                                                                                 0xfffffff8fffffff8)
                                                                       ))))));
  local_2398 = fVar78;
  fStack_2394 = fVar78;
  fStack_2390 = fVar78;
  fStack_238c = fVar78;
  fStack_2388 = fVar78;
  fStack_2384 = fVar78;
  fStack_2380 = fVar78;
  fStack_237c = fVar78;
  local_23b8 = fVar85;
  fStack_23b4 = fVar85;
  fStack_23b0 = fVar85;
  fStack_23ac = fVar85;
  fStack_23a8 = fVar85;
  fStack_23a4 = fVar85;
  fStack_23a0 = fVar85;
  fStack_239c = fVar85;
  local_23d8 = fVar93;
  fStack_23d4 = fVar93;
  fStack_23d0 = fVar93;
  fStack_23cc = fVar93;
  fStack_23c8 = fVar93;
  fStack_23c4 = fVar93;
  fStack_23c0 = fVar93;
  fStack_23bc = fVar93;
  local_23f8 = fVar100;
  fStack_23f4 = fVar100;
  fStack_23f0 = fVar100;
  fStack_23ec = fVar100;
  fStack_23e8 = fVar100;
  fStack_23e4 = fVar100;
  fStack_23e0 = fVar100;
  fStack_23dc = fVar100;
  fVar79 = fVar78;
  fVar80 = fVar78;
  fVar81 = fVar78;
  fVar82 = fVar78;
  fVar83 = fVar78;
  fVar84 = fVar78;
  fVar87 = fVar85;
  fVar88 = fVar85;
  fVar89 = fVar85;
  fVar90 = fVar85;
  fVar91 = fVar85;
  fVar92 = fVar85;
  fVar94 = fVar93;
  fVar95 = fVar93;
  fVar96 = fVar93;
  fVar97 = fVar93;
  fVar98 = fVar93;
  fVar99 = fVar93;
  fVar101 = fVar100;
  fVar102 = fVar100;
  fVar103 = fVar100;
  fVar104 = fVar100;
  fVar105 = fVar100;
  fVar106 = fVar100;
  local_2678 = uVar30;
  do {
    pSVar14 = local_2670 + -1;
    local_2670 = local_2670 + -1;
    if ((float)pSVar14->dist <= *(float *)(ray + k * 4 + 0x80)) {
      sVar35 = (local_2670->ptr).ptr;
      while ((sVar35 & 8) == 0) {
        pauVar16 = (undefined1 (*) [32])(sVar35 & 0xfffffffffffffff0);
        uVar77 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar67._4_4_ = uVar77;
        auVar67._0_4_ = uVar77;
        auVar67._8_4_ = uVar77;
        auVar67._12_4_ = uVar77;
        auVar67._16_4_ = uVar77;
        auVar67._20_4_ = uVar77;
        auVar67._24_4_ = uVar77;
        auVar67._28_4_ = uVar77;
        auVar59 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar16[8] + uVar30),auVar67,
                                  *(undefined1 (*) [32])(pauVar16[2] + uVar30));
        auVar60 = vsubps_avx512vl(ZEXT1632(auVar59),auVar110._0_32_);
        auVar60 = vmulps_avx512vl(auVar113._0_32_,auVar60);
        auVar60 = vmaxps_avx(auVar107._0_32_,auVar60);
        auVar59 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar16[8] + uVar22),auVar67,
                                  *(undefined1 (*) [32])(pauVar16[2] + uVar22));
        auVar61 = vsubps_avx512vl(ZEXT1632(auVar59),auVar111._0_32_);
        auVar62 = vmulps_avx512vl(auVar114._0_32_,auVar61);
        auVar59 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar16[8] + uVar36),auVar67,
                                  *(undefined1 (*) [32])(pauVar16[2] + uVar36));
        auVar63 = vsubps_avx512vl(ZEXT1632(auVar59),auVar112._0_32_);
        auVar61._4_4_ = fVar79 * auVar63._4_4_;
        auVar61._0_4_ = fVar78 * auVar63._0_4_;
        auVar61._8_4_ = fVar80 * auVar63._8_4_;
        auVar61._12_4_ = fVar81 * auVar63._12_4_;
        auVar61._16_4_ = fVar82 * auVar63._16_4_;
        auVar61._20_4_ = fVar83 * auVar63._20_4_;
        auVar61._24_4_ = fVar84 * auVar63._24_4_;
        auVar61._28_4_ = auVar63._28_4_;
        auVar61 = vmaxps_avx(auVar62,auVar61);
        auVar60 = vmaxps_avx(auVar60,auVar61);
        auVar59 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar16[8] + uVar23),auVar67,
                                  *(undefined1 (*) [32])(pauVar16[2] + uVar23));
        auVar61 = vsubps_avx512vl(ZEXT1632(auVar59),auVar110._0_32_);
        auVar62._4_4_ = fVar87 * auVar61._4_4_;
        auVar62._0_4_ = fVar85 * auVar61._0_4_;
        auVar62._8_4_ = fVar88 * auVar61._8_4_;
        auVar62._12_4_ = fVar89 * auVar61._12_4_;
        auVar62._16_4_ = fVar90 * auVar61._16_4_;
        auVar62._20_4_ = fVar91 * auVar61._20_4_;
        auVar62._24_4_ = fVar92 * auVar61._24_4_;
        auVar62._28_4_ = auVar61._28_4_;
        auVar59 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar16[8] + (uVar22 ^ 0x20)),auVar67,
                                  *(undefined1 (*) [32])(pauVar16[2] + (uVar22 ^ 0x20)));
        auVar61 = vsubps_avx512vl(ZEXT1632(auVar59),auVar111._0_32_);
        auVar63._4_4_ = fVar94 * auVar61._4_4_;
        auVar63._0_4_ = fVar93 * auVar61._0_4_;
        auVar63._8_4_ = fVar95 * auVar61._8_4_;
        auVar63._12_4_ = fVar96 * auVar61._12_4_;
        auVar63._16_4_ = fVar97 * auVar61._16_4_;
        auVar63._20_4_ = fVar98 * auVar61._20_4_;
        auVar63._24_4_ = fVar99 * auVar61._24_4_;
        auVar63._28_4_ = auVar61._28_4_;
        auVar59 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar16[8] + (uVar36 ^ 0x20)),auVar67,
                                  *(undefined1 (*) [32])(pauVar16[2] + (uVar36 ^ 0x20)));
        auVar61 = vsubps_avx512vl(ZEXT1632(auVar59),auVar112._0_32_);
        auVar64._4_4_ = fVar101 * auVar61._4_4_;
        auVar64._0_4_ = fVar100 * auVar61._0_4_;
        auVar64._8_4_ = fVar102 * auVar61._8_4_;
        auVar64._12_4_ = fVar103 * auVar61._12_4_;
        auVar64._16_4_ = fVar104 * auVar61._16_4_;
        auVar64._20_4_ = fVar105 * auVar61._20_4_;
        auVar64._24_4_ = fVar106 * auVar61._24_4_;
        auVar64._28_4_ = auVar61._28_4_;
        auVar61 = vminps_avx(auVar63,auVar64);
        auVar62 = vminps_avx(auVar70._0_32_,auVar62);
        auVar61 = vminps_avx(auVar62,auVar61);
        uVar37 = vcmpps_avx512vl(auVar60,auVar61,2);
        if (((uint)sVar35 & 7) == 6) {
          uVar25 = vcmpps_avx512vl(auVar67,pauVar16[0xe],0xd);
          uVar26 = vcmpps_avx512vl(auVar67,pauVar16[0xf],1);
          uVar37 = uVar37 & uVar25 & uVar26;
        }
        bVar15 = (byte)uVar37;
        if (bVar15 == 0) goto LAB_00791f9b;
        auVar61 = *pauVar16;
        auVar62 = pauVar16[1];
        auVar63 = vpternlogd_avx512vl(auVar108._0_32_,auVar60,auVar109._0_32_,0xf8);
        auVar64 = vpcompressd_avx512vl(auVar63);
        auVar66._0_4_ =
             (uint)(bVar15 & 1) * auVar64._0_4_ | (uint)!(bool)(bVar15 & 1) * auVar63._0_4_;
        bVar8 = (bool)((byte)(uVar37 >> 1) & 1);
        auVar66._4_4_ = (uint)bVar8 * auVar64._4_4_ | (uint)!bVar8 * auVar63._4_4_;
        bVar8 = (bool)((byte)(uVar37 >> 2) & 1);
        auVar66._8_4_ = (uint)bVar8 * auVar64._8_4_ | (uint)!bVar8 * auVar63._8_4_;
        bVar8 = (bool)((byte)(uVar37 >> 3) & 1);
        auVar66._12_4_ = (uint)bVar8 * auVar64._12_4_ | (uint)!bVar8 * auVar63._12_4_;
        bVar8 = (bool)((byte)(uVar37 >> 4) & 1);
        auVar66._16_4_ = (uint)bVar8 * auVar64._16_4_ | (uint)!bVar8 * auVar63._16_4_;
        bVar8 = (bool)((byte)(uVar37 >> 5) & 1);
        auVar66._20_4_ = (uint)bVar8 * auVar64._20_4_ | (uint)!bVar8 * auVar63._20_4_;
        bVar8 = (bool)((byte)(uVar37 >> 6) & 1);
        auVar66._24_4_ = (uint)bVar8 * auVar64._24_4_ | (uint)!bVar8 * auVar63._24_4_;
        bVar8 = SUB81(uVar37 >> 7,0);
        auVar66._28_4_ = (uint)bVar8 * auVar64._28_4_ | (uint)!bVar8 * auVar63._28_4_;
        auVar63 = vpermt2q_avx512vl(auVar61,auVar66,auVar62);
        sVar35 = auVar63._0_8_;
        bVar15 = bVar15 - 1 & bVar15;
        if (bVar15 != 0) {
          auVar63 = vpshufd_avx2(auVar66,0x55);
          vpermt2q_avx512vl(auVar61,auVar63,auVar62);
          auVar64 = vpminsd_avx2(auVar66,auVar63);
          auVar63 = vpmaxsd_avx2(auVar66,auVar63);
          bVar15 = bVar15 - 1 & bVar15;
          if (bVar15 == 0) {
            auVar64 = vpermi2q_avx512vl(auVar64,auVar61,auVar62);
            sVar35 = auVar64._0_8_;
            auVar61 = vpermt2q_avx512vl(auVar61,auVar63,auVar62);
            (local_2670->ptr).ptr = auVar61._0_8_;
            auVar60 = vpermd_avx2(auVar63,auVar60);
            local_2670->dist = auVar60._0_4_;
            local_2670 = local_2670 + 1;
          }
          else {
            auVar68 = vpshufd_avx2(auVar66,0xaa);
            vpermt2q_avx512vl(auVar61,auVar68,auVar62);
            auVar67 = vpminsd_avx2(auVar64,auVar68);
            auVar64 = vpmaxsd_avx2(auVar64,auVar68);
            auVar68 = vpminsd_avx2(auVar63,auVar64);
            auVar63 = vpmaxsd_avx2(auVar63,auVar64);
            bVar15 = bVar15 - 1 & bVar15;
            if (bVar15 == 0) {
              auVar64 = vpermi2q_avx512vl(auVar67,auVar61,auVar62);
              sVar35 = auVar64._0_8_;
              auVar64 = vpermt2q_avx512vl(auVar61,auVar63,auVar62);
              (local_2670->ptr).ptr = auVar64._0_8_;
              auVar63 = vpermd_avx2(auVar63,auVar60);
              local_2670->dist = auVar63._0_4_;
              auVar61 = vpermt2q_avx512vl(auVar61,auVar68,auVar62);
              local_2670[1].ptr.ptr = auVar61._0_8_;
              auVar60 = vpermd_avx2(auVar68,auVar60);
              local_2670[1].dist = auVar60._0_4_;
              local_2670 = local_2670 + 2;
            }
            else {
              auVar64 = vpshufd_avx2(auVar66,0xff);
              vpermt2q_avx512vl(auVar61,auVar64,auVar62);
              auVar73 = vpminsd_avx2(auVar67,auVar64);
              auVar64 = vpmaxsd_avx2(auVar67,auVar64);
              auVar67 = vpminsd_avx2(auVar68,auVar64);
              auVar64 = vpmaxsd_avx2(auVar68,auVar64);
              auVar68 = vpminsd_avx2(auVar63,auVar64);
              auVar63 = vpmaxsd_avx2(auVar63,auVar64);
              bVar15 = bVar15 - 1 & bVar15;
              if (bVar15 == 0) {
                auVar64 = vpermi2q_avx512vl(auVar73,auVar61,auVar62);
                sVar35 = auVar64._0_8_;
                auVar64 = vpermt2q_avx512vl(auVar61,auVar63,auVar62);
                (local_2670->ptr).ptr = auVar64._0_8_;
                auVar63 = vpermd_avx2(auVar63,auVar60);
                local_2670->dist = auVar63._0_4_;
                auVar63 = vpermt2q_avx512vl(auVar61,auVar68,auVar62);
                local_2670[1].ptr.ptr = auVar63._0_8_;
                auVar63 = vpermd_avx2(auVar68,auVar60);
                local_2670[1].dist = auVar63._0_4_;
                auVar61 = vpermt2q_avx512vl(auVar61,auVar67,auVar62);
                local_2670[2].ptr.ptr = auVar61._0_8_;
                auVar60 = vpermd_avx2(auVar67,auVar60);
                local_2670[2].dist = auVar60._0_4_;
                local_2670 = local_2670 + 3;
              }
              else {
                auVar65 = valignd_avx512vl(auVar66,auVar66,3);
                auVar64 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                auVar66 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                               CONCAT48(0x80000000,
                                                                        0x8000000080000000))),
                                            auVar64,auVar73);
                auVar64 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                auVar67 = vpermt2d_avx512vl(auVar66,auVar64,auVar67);
                auVar67 = vpermt2d_avx512vl(auVar67,auVar64,auVar68);
                auVar64 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                auVar63 = vpermt2d_avx512vl(auVar67,auVar64,auVar63);
                auVar110 = ZEXT3264(auVar63);
                bVar19 = bVar15;
                do {
                  auVar64 = auVar110._0_32_;
                  auVar73._8_4_ = 1;
                  auVar73._0_8_ = 0x100000001;
                  auVar73._12_4_ = 1;
                  auVar73._16_4_ = 1;
                  auVar73._20_4_ = 1;
                  auVar73._24_4_ = 1;
                  auVar73._28_4_ = 1;
                  auVar63 = vpermd_avx2(auVar73,auVar65);
                  auVar65 = valignd_avx512vl(auVar65,auVar65,1);
                  vpermt2q_avx512vl(auVar61,auVar65,auVar62);
                  bVar19 = bVar19 - 1 & bVar19;
                  uVar10 = vpcmpd_avx512vl(auVar63,auVar64,5);
                  auVar63 = vpmaxsd_avx2(auVar63,auVar64);
                  bVar24 = (byte)uVar10 << 1;
                  auVar64 = valignd_avx512vl(auVar64,auVar64,7);
                  bVar8 = (bool)((byte)uVar10 & 1);
                  auVar68._4_4_ = (uint)bVar8 * auVar64._4_4_ | (uint)!bVar8 * auVar63._4_4_;
                  auVar68._0_4_ = auVar63._0_4_;
                  bVar8 = (bool)(bVar24 >> 2 & 1);
                  auVar68._8_4_ = (uint)bVar8 * auVar64._8_4_ | (uint)!bVar8 * auVar63._8_4_;
                  bVar8 = (bool)(bVar24 >> 3 & 1);
                  auVar68._12_4_ = (uint)bVar8 * auVar64._12_4_ | (uint)!bVar8 * auVar63._12_4_;
                  bVar8 = (bool)(bVar24 >> 4 & 1);
                  auVar68._16_4_ = (uint)bVar8 * auVar64._16_4_ | (uint)!bVar8 * auVar63._16_4_;
                  bVar8 = (bool)(bVar24 >> 5 & 1);
                  auVar68._20_4_ = (uint)bVar8 * auVar64._20_4_ | (uint)!bVar8 * auVar63._20_4_;
                  bVar8 = (bool)(bVar24 >> 6 & 1);
                  auVar68._24_4_ = (uint)bVar8 * auVar64._24_4_ | (uint)!bVar8 * auVar63._24_4_;
                  auVar68._28_4_ =
                       (uint)(bVar24 >> 7) * auVar64._28_4_ |
                       (uint)!(bool)(bVar24 >> 7) * auVar63._28_4_;
                  auVar110 = ZEXT3264(auVar68);
                } while (bVar19 != 0);
                lVar17 = (ulong)(uint)POPCOUNT((uint)bVar15) + 3;
                do {
                  auVar63 = vpermi2q_avx512vl(auVar68,auVar61,auVar62);
                  (local_2670->ptr).ptr = auVar63._0_8_;
                  auVar64 = auVar110._0_32_;
                  auVar63 = vpermd_avx2(auVar64,auVar60);
                  local_2670->dist = auVar63._0_4_;
                  auVar68 = valignd_avx512vl(auVar64,auVar64,1);
                  local_2670 = local_2670 + 1;
                  auVar110 = ZEXT3264(auVar68);
                  lVar17 = lVar17 + -1;
                } while (lVar17 != 0);
                auVar60 = vpermt2q_avx512vl(auVar61,auVar68,auVar62);
                sVar35 = auVar60._0_8_;
              }
              auVar110 = ZEXT3264(local_2588);
              auVar111 = ZEXT3264(local_25a8);
              auVar112 = ZEXT3264(local_25c8);
              auVar113 = ZEXT3264(local_25e8);
              auVar114 = ZEXT3264(local_2608);
              auVar107 = ZEXT3264(auVar107._0_32_);
              auVar108 = ZEXT3264(auVar108._0_32_);
              auVar109 = ZEXT3264(auVar109._0_32_);
            }
          }
        }
      }
      local_2668 = (ulong)((uint)sVar35 & 0xf) - 8;
      if (local_2668 != 0) {
        uVar30 = sVar35 & 0xfffffffffffffff0;
        local_2658 = 0;
        do {
          lVar21 = local_2658 * 0x50;
          local_2650 = context->scene;
          pGVar4 = (local_2650->geometries).items[*(uint *)(uVar30 + 0x30 + lVar21)].ptr;
          fVar85 = (pGVar4->time_range).lower;
          fVar85 = pGVar4->fnumTimeSegments *
                   ((*(float *)(ray + k * 4 + 0x70) - fVar85) /
                   ((pGVar4->time_range).upper - fVar85));
          auVar59 = vroundss_avx(ZEXT416((uint)fVar85),ZEXT416((uint)fVar85),9);
          auVar59 = vminss_avx(auVar59,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
          auVar74 = vmaxss_avx(ZEXT816(0) << 0x20,auVar59);
          lVar18 = (long)(int)auVar74._0_4_ * 0x38;
          uVar28 = (ulong)*(uint *)(uVar30 + 4 + lVar21);
          lVar17 = *(long *)(*(long *)&pGVar4[2].numPrimitives + lVar18);
          lVar18 = *(long *)(*(long *)&pGVar4[2].numPrimitives + 0x38 + lVar18);
          auVar59 = *(undefined1 (*) [16])(lVar17 + (ulong)*(uint *)(uVar30 + lVar21) * 4);
          uVar37 = (ulong)*(uint *)(uVar30 + 0x10 + lVar21);
          auVar55 = *(undefined1 (*) [16])(lVar17 + uVar37 * 4);
          uVar25 = (ulong)*(uint *)(uVar30 + 0x20 + lVar21);
          auVar53 = *(undefined1 (*) [16])(lVar17 + uVar25 * 4);
          auVar38 = *(undefined1 (*) [16])(lVar17 + uVar28 * 4);
          uVar26 = (ulong)*(uint *)(uVar30 + 0x14 + lVar21);
          auVar52 = *(undefined1 (*) [16])(lVar17 + uVar26 * 4);
          local_2660 = (ulong)*(uint *)(uVar30 + 0x24 + lVar21);
          auVar54 = *(undefined1 (*) [16])(lVar17 + local_2660 * 4);
          uVar34 = (ulong)*(uint *)(uVar30 + 8 + lVar21);
          auVar39 = *(undefined1 (*) [16])(lVar17 + uVar34 * 4);
          uVar33 = (ulong)*(uint *)(uVar30 + 0x18 + lVar21);
          auVar41 = *(undefined1 (*) [16])(lVar17 + uVar33 * 4);
          uVar32 = (ulong)*(uint *)(uVar30 + 0x28 + lVar21);
          auVar51 = *(undefined1 (*) [16])(lVar17 + uVar32 * 4);
          uVar31 = (ulong)*(uint *)(uVar30 + 0xc + lVar21);
          auVar49 = *(undefined1 (*) [16])(lVar17 + uVar31 * 4);
          uVar29 = (ulong)*(uint *)(uVar30 + 0x1c + lVar21);
          auVar50 = *(undefined1 (*) [16])(lVar17 + uVar29 * 4);
          uVar27 = (ulong)*(uint *)(uVar30 + 0x2c + lVar21);
          auVar40 = *(undefined1 (*) [16])(lVar17 + uVar27 * 4);
          auVar42 = *(undefined1 (*) [16])(lVar18 + (ulong)*(uint *)(uVar30 + lVar21) * 4);
          auVar43 = *(undefined1 (*) [16])(lVar18 + uVar37 * 4);
          auVar46 = *(undefined1 (*) [16])(lVar18 + uVar25 * 4);
          auVar44 = *(undefined1 (*) [16])(lVar18 + uVar28 * 4);
          auVar45 = *(undefined1 (*) [16])(lVar18 + uVar26 * 4);
          auVar47 = *(undefined1 (*) [16])(lVar18 + local_2660 * 4);
          auVar48 = *(undefined1 (*) [16])(lVar18 + uVar34 * 4);
          auVar56 = *(undefined1 (*) [16])(lVar18 + uVar33 * 4);
          auVar57 = *(undefined1 (*) [16])(lVar18 + uVar32 * 4);
          auVar58 = *(undefined1 (*) [16])(lVar18 + uVar31 * 4);
          auVar71 = *(undefined1 (*) [16])(lVar18 + uVar29 * 4);
          auVar72 = *(undefined1 (*) [16])(lVar18 + uVar27 * 4);
          puVar1 = (undefined8 *)(uVar30 + 0x30 + lVar21);
          local_24b8 = *puVar1;
          uStack_24b0 = puVar1[1];
          puVar1 = (undefined8 *)(uVar30 + 0x40 + lVar21);
          auVar75 = vunpcklps_avx(auVar59,auVar39);
          auVar59 = vunpckhps_avx(auVar59,auVar39);
          auVar39 = vunpcklps_avx(auVar38,auVar49);
          auVar38 = vunpckhps_avx(auVar38,auVar49);
          auVar49 = vunpcklps_avx(auVar59,auVar38);
          auVar76 = vunpcklps_avx(auVar75,auVar39);
          auVar59 = vunpckhps_avx(auVar75,auVar39);
          auVar39 = vunpcklps_avx(auVar55,auVar41);
          auVar55 = vunpckhps_avx(auVar55,auVar41);
          auVar41 = vunpcklps_avx(auVar52,auVar50);
          auVar38 = vunpckhps_avx(auVar52,auVar50);
          auVar52 = vunpcklps_avx(auVar55,auVar38);
          auVar50 = vunpcklps_avx(auVar39,auVar41);
          auVar55 = vunpckhps_avx(auVar39,auVar41);
          auVar39 = vunpcklps_avx(auVar53,auVar51);
          auVar53 = vunpckhps_avx(auVar53,auVar51);
          auVar41 = vunpcklps_avx(auVar54,auVar40);
          auVar38 = vunpckhps_avx(auVar54,auVar40);
          auVar54 = vunpcklps_avx(auVar53,auVar38);
          auVar51 = vunpcklps_avx(auVar39,auVar41);
          auVar53 = vunpckhps_avx(auVar39,auVar41);
          auVar38 = vunpcklps_avx512vl(auVar42,auVar48);
          auVar39 = vunpckhps_avx512vl(auVar42,auVar48);
          auVar40 = vunpcklps_avx512vl(auVar44,auVar58);
          auVar41 = vunpckhps_avx512vl(auVar44,auVar58);
          auVar39 = vunpcklps_avx(auVar39,auVar41);
          auVar41 = vunpcklps_avx(auVar38,auVar40);
          auVar38 = vunpckhps_avx(auVar38,auVar40);
          auVar40 = vunpcklps_avx512vl(auVar43,auVar56);
          auVar42 = vunpckhps_avx512vl(auVar43,auVar56);
          auVar43 = vunpcklps_avx512vl(auVar45,auVar71);
          auVar44 = vunpckhps_avx512vl(auVar45,auVar71);
          auVar42 = vunpcklps_avx512vl(auVar42,auVar44);
          auVar44 = vunpcklps_avx512vl(auVar40,auVar43);
          auVar43 = vunpckhps_avx512vl(auVar40,auVar43);
          auVar45 = vunpcklps_avx512vl(auVar46,auVar57);
          auVar40 = vunpckhps_avx512vl(auVar46,auVar57);
          auVar46 = vunpcklps_avx512vl(auVar47,auVar72);
          auVar47 = vunpckhps_avx512vl(auVar47,auVar72);
          auVar40 = vunpcklps_avx(auVar40,auVar47);
          auVar47 = vunpcklps_avx512vl(auVar45,auVar46);
          auVar46 = vunpckhps_avx512vl(auVar45,auVar46);
          auVar48 = ZEXT416((uint)(fVar85 - auVar74._0_4_));
          auVar45 = vbroadcastss_avx512vl(auVar48);
          auVar48 = vsubss_avx512f(ZEXT416(0x3f800000),auVar48);
          auVar56._0_4_ = auVar48._0_4_;
          auVar56._4_4_ = auVar56._0_4_;
          auVar56._8_4_ = auVar56._0_4_;
          auVar56._12_4_ = auVar56._0_4_;
          auVar41 = vmulps_avx512vl(auVar45,auVar41);
          auVar48 = vmulps_avx512vl(auVar45,auVar38);
          auVar39 = vmulps_avx512vl(auVar45,auVar39);
          auVar38 = vfmadd231ps_fma(auVar41,auVar56,auVar76);
          auVar48 = vfmadd231ps_avx512vl(auVar48,auVar56,auVar59);
          auVar59 = vfmadd231ps_fma(auVar39,auVar56,auVar49);
          auVar39 = vmulps_avx512vl(auVar45,auVar44);
          auVar41 = vmulps_avx512vl(auVar45,auVar43);
          auVar49 = vmulps_avx512vl(auVar45,auVar42);
          auVar39 = vfmadd231ps_fma(auVar39,auVar56,auVar50);
          auVar55 = vfmadd231ps_fma(auVar41,auVar56,auVar55);
          auVar52 = vfmadd231ps_fma(auVar49,auVar56,auVar52);
          auVar41 = vmulps_avx512vl(auVar45,auVar47);
          auVar49 = vmulps_avx512vl(auVar45,auVar46);
          auVar50 = vmulps_avx512vl(auVar45,auVar40);
          auVar41 = vfmadd231ps_fma(auVar41,auVar56,auVar51);
          auVar53 = vfmadd231ps_fma(auVar49,auVar56,auVar53);
          local_2618 = *puVar1;
          uStack_2610 = puVar1[1];
          auVar51 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4)));
          auVar49 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
          auVar40 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
          uVar77 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar75._4_4_ = uVar77;
          auVar75._0_4_ = uVar77;
          auVar75._8_4_ = uVar77;
          auVar75._12_4_ = uVar77;
          uVar77 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar76._4_4_ = uVar77;
          auVar76._0_4_ = uVar77;
          auVar76._8_4_ = uVar77;
          auVar76._12_4_ = uVar77;
          auVar54 = vfmadd231ps_fma(auVar50,auVar56,auVar54);
          fVar85 = *(float *)(ray + k * 4 + 0x60);
          auVar86._4_4_ = fVar85;
          auVar86._0_4_ = fVar85;
          auVar86._8_4_ = fVar85;
          auVar86._12_4_ = fVar85;
          auVar38 = vsubps_avx512vl(auVar38,auVar51);
          auVar50 = vsubps_avx512vl(auVar48,auVar49);
          auVar42 = vsubps_avx512vl(auVar59,auVar40);
          auVar39 = vsubps_avx512vl(auVar39,auVar51);
          auVar43 = vsubps_avx512vl(auVar55,auVar49);
          auVar52 = vsubps_avx512vl(auVar52,auVar40);
          auVar41 = vsubps_avx512vl(auVar41,auVar51);
          auVar53 = vsubps_avx512vl(auVar53,auVar49);
          auVar54 = vsubps_avx512vl(auVar54,auVar40);
          auVar51 = vsubps_avx512vl(auVar41,auVar38);
          auVar49 = vsubps_avx512vl(auVar53,auVar50);
          auVar59 = vsubps_avx(auVar54,auVar42);
          auVar40 = vsubps_avx512vl(auVar38,auVar39);
          auVar46 = vsubps_avx512vl(auVar50,auVar43);
          auVar44 = vsubps_avx512vl(auVar42,auVar52);
          auVar45 = vsubps_avx512vl(auVar39,auVar41);
          auVar47 = vsubps_avx512vl(auVar43,auVar53);
          auVar48 = vsubps_avx512vl(auVar52,auVar54);
          auVar55 = vaddps_avx512vl(auVar41,auVar38);
          auVar56 = vaddps_avx512vl(auVar53,auVar50);
          auVar57 = vaddps_avx512vl(auVar54,auVar42);
          auVar58 = vmulps_avx512vl(auVar56,auVar59);
          auVar58 = vfmsub231ps_avx512vl(auVar58,auVar49,auVar57);
          auVar57 = vmulps_avx512vl(auVar57,auVar51);
          auVar57 = vfmsub231ps_avx512vl(auVar57,auVar59,auVar55);
          auVar71._0_4_ = auVar49._0_4_ * auVar55._0_4_;
          auVar71._4_4_ = auVar49._4_4_ * auVar55._4_4_;
          auVar71._8_4_ = auVar49._8_4_ * auVar55._8_4_;
          auVar71._12_4_ = auVar49._12_4_ * auVar55._12_4_;
          auVar55 = vfmsub231ps_fma(auVar71,auVar51,auVar56);
          auVar72._0_4_ = fVar85 * auVar55._0_4_;
          auVar72._4_4_ = fVar85 * auVar55._4_4_;
          auVar72._8_4_ = fVar85 * auVar55._8_4_;
          auVar72._12_4_ = fVar85 * auVar55._12_4_;
          auVar55 = vfmadd231ps_avx512vl(auVar72,auVar76,auVar57);
          local_2568 = vfmadd231ps_avx512vl(auVar55,auVar75,auVar58);
          auVar58._0_4_ = auVar39._0_4_ + auVar38._0_4_;
          auVar58._4_4_ = auVar39._4_4_ + auVar38._4_4_;
          auVar58._8_4_ = auVar39._8_4_ + auVar38._8_4_;
          auVar58._12_4_ = auVar39._12_4_ + auVar38._12_4_;
          auVar55 = vaddps_avx512vl(auVar50,auVar43);
          auVar56 = vaddps_avx512vl(auVar42,auVar52);
          auVar57 = vmulps_avx512vl(auVar55,auVar44);
          auVar57 = vfmsub231ps_avx512vl(auVar57,auVar46,auVar56);
          auVar56 = vmulps_avx512vl(auVar56,auVar40);
          auVar56 = vfmsub231ps_avx512vl(auVar56,auVar44,auVar58);
          auVar58 = vmulps_avx512vl(auVar58,auVar46);
          auVar55 = vfmsub231ps_avx512vl(auVar58,auVar40,auVar55);
          auVar74._0_4_ = fVar85 * auVar55._0_4_;
          auVar74._4_4_ = fVar85 * auVar55._4_4_;
          auVar74._8_4_ = fVar85 * auVar55._8_4_;
          auVar74._12_4_ = fVar85 * auVar55._12_4_;
          auVar55 = vfmadd231ps_avx512vl(auVar74,auVar76,auVar56);
          local_2558 = vfmadd231ps_avx512vl(auVar55,auVar75,auVar57);
          auVar39 = vaddps_avx512vl(auVar39,auVar41);
          auVar53 = vaddps_avx512vl(auVar43,auVar53);
          auVar55 = vaddps_avx512vl(auVar52,auVar54);
          auVar52 = vmulps_avx512vl(auVar53,auVar48);
          auVar52 = vfmsub231ps_avx512vl(auVar52,auVar47,auVar55);
          auVar54._0_4_ = auVar55._0_4_ * auVar45._0_4_;
          auVar54._4_4_ = auVar55._4_4_ * auVar45._4_4_;
          auVar54._8_4_ = auVar55._8_4_ * auVar45._8_4_;
          auVar54._12_4_ = auVar55._12_4_ * auVar45._12_4_;
          auVar55 = vfmsub231ps_fma(auVar54,auVar48,auVar39);
          auVar41._0_4_ = auVar39._0_4_ * auVar47._0_4_;
          auVar41._4_4_ = auVar39._4_4_ * auVar47._4_4_;
          auVar41._8_4_ = auVar39._8_4_ * auVar47._8_4_;
          auVar41._12_4_ = auVar39._12_4_ * auVar47._12_4_;
          auVar53 = vfmsub231ps_avx512vl(auVar41,auVar45,auVar53);
          auVar53 = vmulps_avx512vl(auVar53,auVar86);
          auVar55 = vfmadd231ps_avx512vl(auVar53,auVar76,auVar55);
          auVar52 = vfmadd231ps_avx512vl(auVar55,auVar75,auVar52);
          auVar39._0_4_ = local_2568._0_4_ + local_2558._0_4_;
          auVar39._4_4_ = local_2568._4_4_ + local_2558._4_4_;
          auVar39._8_4_ = local_2568._8_4_ + local_2558._8_4_;
          auVar39._12_4_ = local_2568._12_4_ + local_2558._12_4_;
          local_2548 = vaddps_avx512vl(auVar52,auVar39);
          auVar55._8_4_ = 0x7fffffff;
          auVar55._0_8_ = 0x7fffffff7fffffff;
          auVar55._12_4_ = 0x7fffffff;
          auVar55 = vandps_avx512vl(local_2548,auVar55);
          auVar53._8_4_ = 0x34000000;
          auVar53._0_8_ = 0x3400000034000000;
          auVar53._12_4_ = 0x34000000;
          auVar53 = vmulps_avx512vl(auVar55,auVar53);
          auVar54 = vminps_avx512vl(local_2568,local_2558);
          auVar54 = vminps_avx512vl(auVar54,auVar52);
          auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar39 = vxorps_avx512vl(auVar53,auVar39);
          uVar10 = vcmpps_avx512vl(auVar54,auVar39,5);
          auVar54 = vmaxps_avx512vl(local_2568,local_2558);
          auVar52 = vmaxps_avx512vl(auVar54,auVar52);
          uVar9 = vcmpps_avx512vl(auVar52,auVar53,2);
          bVar15 = ((byte)uVar10 | (byte)uVar9) & 0xf;
          if (bVar15 != 0) {
            auVar53 = vmulps_avx512vl(auVar46,auVar59);
            auVar52 = vmulps_avx512vl(auVar51,auVar44);
            auVar54 = vmulps_avx512vl(auVar40,auVar49);
            auVar39 = vmulps_avx512vl(auVar47,auVar44);
            auVar41 = vmulps_avx512vl(auVar40,auVar48);
            auVar43 = vmulps_avx512vl(auVar45,auVar46);
            auVar49 = vfmsub213ps_avx512vl(auVar49,auVar44,auVar53);
            auVar59 = vfmsub213ps_avx512vl(auVar59,auVar40,auVar52);
            auVar51 = vfmsub213ps_avx512vl(auVar51,auVar46,auVar54);
            auVar46 = vfmsub213ps_avx512vl(auVar48,auVar46,auVar39);
            auVar44 = vfmsub213ps_avx512vl(auVar45,auVar44,auVar41);
            auVar40 = vfmsub213ps_avx512vl(auVar47,auVar40,auVar43);
            auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar53 = vandps_avx512vl(auVar53,auVar45);
            auVar39 = vandps_avx512vl(auVar39,auVar45);
            uVar37 = vcmpps_avx512vl(auVar53,auVar39,1);
            auVar53 = vandps_avx512vl(auVar52,auVar45);
            auVar52 = vandps_avx512vl(auVar41,auVar45);
            uVar25 = vcmpps_avx512vl(auVar53,auVar52,1);
            auVar53 = vandps_avx512vl(auVar54,auVar45);
            auVar52 = vandps_avx512vl(auVar43,auVar45);
            uVar26 = vcmpps_avx512vl(auVar53,auVar52,1);
            bVar8 = (bool)((byte)uVar37 & 1);
            local_24f8._0_4_ = (uint)bVar8 * auVar49._0_4_ | (uint)!bVar8 * auVar46._0_4_;
            bVar8 = (bool)((byte)(uVar37 >> 1) & 1);
            local_24f8._4_4_ = (uint)bVar8 * auVar49._4_4_ | (uint)!bVar8 * auVar46._4_4_;
            bVar8 = (bool)((byte)(uVar37 >> 2) & 1);
            local_24f8._8_4_ = (uint)bVar8 * auVar49._8_4_ | (uint)!bVar8 * auVar46._8_4_;
            bVar8 = (bool)((byte)(uVar37 >> 3) & 1);
            local_24f8._12_4_ = (uint)bVar8 * auVar49._12_4_ | (uint)!bVar8 * auVar46._12_4_;
            bVar8 = (bool)((byte)uVar25 & 1);
            local_24e8._0_4_ = (uint)bVar8 * auVar59._0_4_ | (uint)!bVar8 * auVar44._0_4_;
            bVar8 = (bool)((byte)(uVar25 >> 1) & 1);
            local_24e8._4_4_ = (uint)bVar8 * auVar59._4_4_ | (uint)!bVar8 * auVar44._4_4_;
            bVar8 = (bool)((byte)(uVar25 >> 2) & 1);
            local_24e8._8_4_ = (uint)bVar8 * auVar59._8_4_ | (uint)!bVar8 * auVar44._8_4_;
            bVar8 = (bool)((byte)(uVar25 >> 3) & 1);
            local_24e8._12_4_ = (uint)bVar8 * auVar59._12_4_ | (uint)!bVar8 * auVar44._12_4_;
            bVar8 = (bool)((byte)uVar26 & 1);
            local_24d8[0] = (float)((uint)bVar8 * auVar51._0_4_ | (uint)!bVar8 * auVar40._0_4_);
            bVar8 = (bool)((byte)(uVar26 >> 1) & 1);
            local_24d8[1] = (float)((uint)bVar8 * auVar51._4_4_ | (uint)!bVar8 * auVar40._4_4_);
            bVar8 = (bool)((byte)(uVar26 >> 2) & 1);
            local_24d8[2] = (float)((uint)bVar8 * auVar51._8_4_ | (uint)!bVar8 * auVar40._8_4_);
            bVar8 = (bool)((byte)(uVar26 >> 3) & 1);
            local_24d8[3] = (float)((uint)bVar8 * auVar51._12_4_ | (uint)!bVar8 * auVar40._12_4_);
            auVar40._0_4_ = fVar85 * local_24d8[0];
            auVar40._4_4_ = fVar85 * local_24d8[1];
            auVar40._8_4_ = fVar85 * local_24d8[2];
            auVar40._12_4_ = fVar85 * local_24d8[3];
            auVar59 = vfmadd213ps_fma(auVar76,local_24e8,auVar40);
            auVar59 = vfmadd213ps_fma(auVar75,local_24f8,auVar59);
            auVar52._0_4_ = auVar59._0_4_ + auVar59._0_4_;
            auVar52._4_4_ = auVar59._4_4_ + auVar59._4_4_;
            auVar52._8_4_ = auVar59._8_4_ + auVar59._8_4_;
            auVar52._12_4_ = auVar59._12_4_ + auVar59._12_4_;
            auVar51._0_4_ = auVar42._0_4_ * local_24d8[0];
            auVar51._4_4_ = auVar42._4_4_ * local_24d8[1];
            auVar51._8_4_ = auVar42._8_4_ * local_24d8[2];
            auVar51._12_4_ = auVar42._12_4_ * local_24d8[3];
            auVar59 = vfmadd213ps_fma(auVar50,local_24e8,auVar51);
            auVar53 = vfmadd213ps_fma(auVar38,local_24f8,auVar59);
            auVar38 = vrcp14ps_avx512vl(auVar52);
            auVar59._8_4_ = 0x3f800000;
            auVar59._0_8_ = 0x3f8000003f800000;
            auVar59._12_4_ = 0x3f800000;
            auVar59 = vfnmadd213ps_avx512vl(auVar38,auVar52,auVar59);
            auVar59 = vfmadd132ps_fma(auVar59,auVar38,auVar38);
            uVar77 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar49._4_4_ = uVar77;
            auVar49._0_4_ = uVar77;
            auVar49._8_4_ = uVar77;
            auVar49._12_4_ = uVar77;
            auVar107 = ZEXT1664(auVar49);
            local_2508._0_4_ = auVar59._0_4_ * (auVar53._0_4_ + auVar53._0_4_);
            local_2508._4_4_ = auVar59._4_4_ * (auVar53._4_4_ + auVar53._4_4_);
            local_2508._8_4_ = auVar59._8_4_ * (auVar53._8_4_ + auVar53._8_4_);
            local_2508._12_4_ = auVar59._12_4_ * (auVar53._12_4_ + auVar53._12_4_);
            auVar70 = ZEXT1664(local_2508);
            uVar10 = vcmpps_avx512vl(local_2508,auVar49,2);
            uVar77 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar38._4_4_ = uVar77;
            auVar38._0_4_ = uVar77;
            auVar38._8_4_ = uVar77;
            auVar38._12_4_ = uVar77;
            uVar9 = vcmpps_avx512vl(local_2508,auVar38,0xd);
            bVar15 = (byte)uVar10 & (byte)uVar9 & bVar15;
            if (bVar15 != 0) {
              uVar10 = vcmpps_avx512vl(auVar52,_DAT_01f7aa10,4);
              bVar15 = bVar15 & (byte)uVar10;
              if (bVar15 != 0) {
                local_2538 = &mapUV;
                local_2530 = bVar15;
                auVar50._8_4_ = 0x219392ef;
                auVar50._0_8_ = 0x219392ef219392ef;
                auVar50._12_4_ = 0x219392ef;
                uVar37 = vcmpps_avx512vl(auVar55,auVar50,5);
                auVar55 = vrcp14ps_avx512vl(local_2548);
                auVar45._8_4_ = 0x3f800000;
                auVar45._0_8_ = 0x3f8000003f800000;
                auVar45._12_4_ = 0x3f800000;
                auVar59 = vfnmadd213ps_fma(local_2548,auVar55,auVar45);
                auVar59 = vfmadd132ps_avx512vl(auVar59,auVar55,auVar55);
                fVar85 = (float)((uint)((byte)uVar37 & 1) * auVar59._0_4_);
                fVar78 = (float)((uint)((byte)(uVar37 >> 1) & 1) * auVar59._4_4_);
                fVar100 = (float)((uint)((byte)(uVar37 >> 2) & 1) * auVar59._8_4_);
                fVar93 = (float)((uint)((byte)(uVar37 >> 3) & 1) * auVar59._12_4_);
                auVar43._0_4_ = fVar85 * local_2568._0_4_;
                auVar43._4_4_ = fVar78 * local_2568._4_4_;
                auVar43._8_4_ = fVar100 * local_2568._8_4_;
                auVar43._12_4_ = fVar93 * local_2568._12_4_;
                local_2528 = vminps_avx(auVar43,auVar45);
                auVar46._0_4_ = fVar85 * local_2558._0_4_;
                auVar46._4_4_ = fVar78 * local_2558._4_4_;
                auVar46._8_4_ = fVar100 * local_2558._8_4_;
                auVar46._12_4_ = fVar93 * local_2558._12_4_;
                local_2518 = vminps_avx(auVar46,auVar45);
                auVar44._8_4_ = 0x7f800000;
                auVar44._0_8_ = 0x7f8000007f800000;
                auVar44._12_4_ = 0x7f800000;
                auVar59 = vblendmps_avx512vl(auVar44,local_2508);
                auVar42._0_4_ =
                     (uint)(bVar15 & 1) * auVar59._0_4_ | (uint)!(bool)(bVar15 & 1) * 0x7f800000;
                bVar8 = (bool)(bVar15 >> 1 & 1);
                auVar42._4_4_ = (uint)bVar8 * auVar59._4_4_ | (uint)!bVar8 * 0x7f800000;
                bVar8 = (bool)(bVar15 >> 2 & 1);
                auVar42._8_4_ = (uint)bVar8 * auVar59._8_4_ | (uint)!bVar8 * 0x7f800000;
                auVar42._12_4_ =
                     (uint)(bVar15 >> 3) * auVar59._12_4_ | (uint)!(bool)(bVar15 >> 3) * 0x7f800000;
                auVar59 = vshufps_avx(auVar42,auVar42,0xb1);
                auVar59 = vminps_avx(auVar59,auVar42);
                auVar55 = vshufpd_avx(auVar59,auVar59,1);
                auVar59 = vminps_avx(auVar55,auVar59);
                uVar10 = vcmpps_avx512vl(auVar42,auVar59,0);
                bVar19 = (byte)uVar10 & bVar15;
                do {
                  bVar24 = bVar15;
                  if (bVar19 != 0) {
                    bVar24 = bVar19;
                  }
                  uVar11 = 0;
                  for (uVar20 = (uint)bVar24; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x80000000)
                  {
                    uVar11 = uVar11 + 1;
                  }
                  uVar20 = *(uint *)((long)&local_24b8 + (ulong)uVar11 * 4);
                  pGVar4 = (local_2650->geometries).items[uVar20].ptr;
                  if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    bVar15 = ~(byte)(1 << (uVar11 & 0x1f)) & bVar15;
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      uVar37 = (ulong)(uVar11 << 2);
                      uVar77 = *(undefined4 *)(local_2528 + uVar37);
                      uVar3 = *(undefined4 *)(local_2518 + uVar37);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2508 + uVar37);
                      *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_24f8 + uVar37);
                      *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_24e8 + uVar37);
                      *(undefined4 *)(ray + k * 4 + 0xe0) =
                           *(undefined4 *)((long)local_24d8 + uVar37);
                      *(undefined4 *)(ray + k * 4 + 0xf0) = uVar77;
                      *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
                      *(undefined4 *)(ray + k * 4 + 0x110) =
                           *(undefined4 *)((long)&local_2618 + uVar37);
                      *(uint *)(ray + k * 4 + 0x120) = uVar20;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      break;
                    }
                    uVar37 = (ulong)(uVar11 * 4);
                    uVar77 = *(undefined4 *)(local_2528 + uVar37);
                    local_2478._4_4_ = uVar77;
                    local_2478._0_4_ = uVar77;
                    local_2478._8_4_ = uVar77;
                    local_2478._12_4_ = uVar77;
                    local_2468 = *(undefined4 *)(local_2518 + uVar37);
                    local_2448 = vpbroadcastd_avx512vl();
                    uVar77 = *(undefined4 *)((long)&local_2618 + uVar37);
                    local_2458._4_4_ = uVar77;
                    local_2458._0_4_ = uVar77;
                    local_2458._8_4_ = uVar77;
                    local_2458._12_4_ = uVar77;
                    uVar77 = *(undefined4 *)(local_24f8 + uVar37);
                    uVar3 = *(undefined4 *)(local_24e8 + uVar37);
                    local_2498._4_4_ = uVar3;
                    local_2498._0_4_ = uVar3;
                    local_2498._8_4_ = uVar3;
                    local_2498._12_4_ = uVar3;
                    uVar3 = *(undefined4 *)((long)local_24d8 + uVar37);
                    local_2488._4_4_ = uVar3;
                    local_2488._0_4_ = uVar3;
                    local_2488._8_4_ = uVar3;
                    local_2488._12_4_ = uVar3;
                    local_24a8[0] = (RTCHitN)(char)uVar77;
                    local_24a8[1] = (RTCHitN)(char)((uint)uVar77 >> 8);
                    local_24a8[2] = (RTCHitN)(char)((uint)uVar77 >> 0x10);
                    local_24a8[3] = (RTCHitN)(char)((uint)uVar77 >> 0x18);
                    local_24a8[4] = (RTCHitN)(char)uVar77;
                    local_24a8[5] = (RTCHitN)(char)((uint)uVar77 >> 8);
                    local_24a8[6] = (RTCHitN)(char)((uint)uVar77 >> 0x10);
                    local_24a8[7] = (RTCHitN)(char)((uint)uVar77 >> 0x18);
                    local_24a8[8] = (RTCHitN)(char)uVar77;
                    local_24a8[9] = (RTCHitN)(char)((uint)uVar77 >> 8);
                    local_24a8[10] = (RTCHitN)(char)((uint)uVar77 >> 0x10);
                    local_24a8[0xb] = (RTCHitN)(char)((uint)uVar77 >> 0x18);
                    local_24a8[0xc] = (RTCHitN)(char)uVar77;
                    local_24a8[0xd] = (RTCHitN)(char)((uint)uVar77 >> 8);
                    local_24a8[0xe] = (RTCHitN)(char)((uint)uVar77 >> 0x10);
                    local_24a8[0xf] = (RTCHitN)(char)((uint)uVar77 >> 0x18);
                    uStack_2464 = local_2468;
                    uStack_2460 = local_2468;
                    uStack_245c = local_2468;
                    vpcmpeqd_avx2(ZEXT1632(local_2478),ZEXT1632(local_2478));
                    uStack_2434 = context->user->instID[0];
                    local_2438 = uStack_2434;
                    uStack_2430 = uStack_2434;
                    uStack_242c = uStack_2434;
                    uStack_2428 = context->user->instPrimID[0];
                    uStack_2424 = uStack_2428;
                    uStack_2420 = uStack_2428;
                    uStack_241c = uStack_2428;
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2508 + uVar37);
                    local_2688 = local_24c8;
                    args.valid = (int *)local_2688;
                    args.geometryUserPtr = pGVar4->userPtr;
                    args.context = context->user;
                    args.hit = local_24a8;
                    args.N = 4;
                    auVar59 = auVar70._0_16_;
                    auVar55 = auVar107._0_16_;
                    args.ray = (RTCRayN *)ray;
                    if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar4->intersectionFilterN)(&args);
                      auVar107 = ZEXT1664(auVar55);
                      auVar70 = ZEXT1664(auVar59);
                      auVar114 = ZEXT3264(local_2608);
                      auVar113 = ZEXT3264(local_25e8);
                      auVar112 = ZEXT3264(local_25c8);
                      auVar111 = ZEXT3264(local_25a8);
                      auVar110 = ZEXT3264(local_2588);
                    }
                    uVar37 = vptestmd_avx512vl(local_2688,local_2688);
                    if ((uVar37 & 0xf) == 0) {
LAB_00791e49:
                      *(int *)(ray + k * 4 + 0x80) = auVar107._0_4_;
                    }
                    else {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var5)(&args);
                        auVar107 = ZEXT1664(auVar55);
                        auVar70 = ZEXT1664(auVar59);
                        auVar114 = ZEXT3264(local_2608);
                        auVar113 = ZEXT3264(local_25e8);
                        auVar112 = ZEXT3264(local_25c8);
                        auVar111 = ZEXT3264(local_25a8);
                        auVar110 = ZEXT3264(local_2588);
                      }
                      uVar37 = vptestmd_avx512vl(local_2688,local_2688);
                      uVar37 = uVar37 & 0xf;
                      bVar19 = (byte)uVar37;
                      if (bVar19 == 0) goto LAB_00791e49;
                      iVar2 = *(int *)(args.hit + 4);
                      iVar12 = *(int *)(args.hit + 8);
                      iVar13 = *(int *)(args.hit + 0xc);
                      bVar8 = (bool)((byte)(uVar37 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar37 >> 2) & 1);
                      bVar7 = SUB81(uVar37 >> 3,0);
                      *(uint *)(args.ray + 0xc0) =
                           (uint)(bVar19 & 1) * *(int *)args.hit |
                           (uint)!(bool)(bVar19 & 1) * *(uint *)(args.ray + 0xc0);
                      *(uint *)(args.ray + 0xc4) =
                           (uint)bVar8 * iVar2 | (uint)!bVar8 * *(int *)(args.ray + 0xc4);
                      *(uint *)(args.ray + 200) =
                           (uint)bVar6 * iVar12 | (uint)!bVar6 * *(int *)(args.ray + 200);
                      *(uint *)(args.ray + 0xcc) =
                           (uint)bVar7 * iVar13 | (uint)!bVar7 * *(int *)(args.ray + 0xcc);
                      iVar2 = *(int *)(args.hit + 0x14);
                      iVar12 = *(int *)(args.hit + 0x18);
                      iVar13 = *(int *)(args.hit + 0x1c);
                      bVar8 = (bool)((byte)(uVar37 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar37 >> 2) & 1);
                      bVar7 = SUB81(uVar37 >> 3,0);
                      *(uint *)(args.ray + 0xd0) =
                           (uint)(bVar19 & 1) * *(int *)(args.hit + 0x10) |
                           (uint)!(bool)(bVar19 & 1) * *(uint *)(args.ray + 0xd0);
                      *(uint *)(args.ray + 0xd4) =
                           (uint)bVar8 * iVar2 | (uint)!bVar8 * *(int *)(args.ray + 0xd4);
                      *(uint *)(args.ray + 0xd8) =
                           (uint)bVar6 * iVar12 | (uint)!bVar6 * *(int *)(args.ray + 0xd8);
                      *(uint *)(args.ray + 0xdc) =
                           (uint)bVar7 * iVar13 | (uint)!bVar7 * *(int *)(args.ray + 0xdc);
                      iVar2 = *(int *)(args.hit + 0x24);
                      iVar12 = *(int *)(args.hit + 0x28);
                      iVar13 = *(int *)(args.hit + 0x2c);
                      bVar8 = (bool)((byte)(uVar37 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar37 >> 2) & 1);
                      bVar7 = SUB81(uVar37 >> 3,0);
                      *(uint *)(args.ray + 0xe0) =
                           (uint)(bVar19 & 1) * *(int *)(args.hit + 0x20) |
                           (uint)!(bool)(bVar19 & 1) * *(uint *)(args.ray + 0xe0);
                      *(uint *)(args.ray + 0xe4) =
                           (uint)bVar8 * iVar2 | (uint)!bVar8 * *(int *)(args.ray + 0xe4);
                      *(uint *)(args.ray + 0xe8) =
                           (uint)bVar6 * iVar12 | (uint)!bVar6 * *(int *)(args.ray + 0xe8);
                      *(uint *)(args.ray + 0xec) =
                           (uint)bVar7 * iVar13 | (uint)!bVar7 * *(int *)(args.ray + 0xec);
                      iVar2 = *(int *)(args.hit + 0x34);
                      iVar12 = *(int *)(args.hit + 0x38);
                      iVar13 = *(int *)(args.hit + 0x3c);
                      bVar8 = (bool)((byte)(uVar37 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar37 >> 2) & 1);
                      bVar7 = SUB81(uVar37 >> 3,0);
                      *(uint *)(args.ray + 0xf0) =
                           (uint)(bVar19 & 1) * *(int *)(args.hit + 0x30) |
                           (uint)!(bool)(bVar19 & 1) * *(uint *)(args.ray + 0xf0);
                      *(uint *)(args.ray + 0xf4) =
                           (uint)bVar8 * iVar2 | (uint)!bVar8 * *(int *)(args.ray + 0xf4);
                      *(uint *)(args.ray + 0xf8) =
                           (uint)bVar6 * iVar12 | (uint)!bVar6 * *(int *)(args.ray + 0xf8);
                      *(uint *)(args.ray + 0xfc) =
                           (uint)bVar7 * iVar13 | (uint)!bVar7 * *(int *)(args.ray + 0xfc);
                      auVar59 = *(undefined1 (*) [16])(args.ray + 0x100);
                      auVar47._0_4_ =
                           (uint)(bVar19 & 1) * *(int *)(args.hit + 0x40) |
                           (uint)!(bool)(bVar19 & 1) * auVar59._0_4_;
                      bVar8 = (bool)((byte)(uVar37 >> 1) & 1);
                      auVar47._4_4_ =
                           (uint)bVar8 * *(int *)(args.hit + 0x44) | (uint)!bVar8 * auVar59._4_4_;
                      bVar8 = (bool)((byte)(uVar37 >> 2) & 1);
                      auVar47._8_4_ =
                           (uint)bVar8 * *(int *)(args.hit + 0x48) | (uint)!bVar8 * auVar59._8_4_;
                      bVar8 = SUB81(uVar37 >> 3,0);
                      auVar47._12_4_ =
                           (uint)bVar8 * *(int *)(args.hit + 0x4c) | (uint)!bVar8 * auVar59._12_4_;
                      *(undefined1 (*) [16])(args.ray + 0x100) = auVar47;
                      auVar59 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x50));
                      *(undefined1 (*) [16])(args.ray + 0x110) = auVar59;
                      auVar59 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x60));
                      *(undefined1 (*) [16])(args.ray + 0x120) = auVar59;
                      auVar59 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x70));
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar59;
                      auVar59 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x80));
                      *(undefined1 (*) [16])(args.ray + 0x140) = auVar59;
                      auVar107 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                    }
                    uVar77 = auVar107._0_4_;
                    auVar48._4_4_ = uVar77;
                    auVar48._0_4_ = uVar77;
                    auVar48._8_4_ = uVar77;
                    auVar48._12_4_ = uVar77;
                    uVar10 = vcmpps_avx512vl(auVar70._0_16_,auVar48,2);
                    bVar15 = ~(byte)(1 << (uVar11 & 0x1f)) & bVar15 & (byte)uVar10;
                  }
                  if (bVar15 == 0) break;
                  auVar69._8_4_ = 0x7f800000;
                  auVar69._0_8_ = 0x7f8000007f800000;
                  auVar69._12_4_ = 0x7f800000;
                  auVar59 = vblendmps_avx512vl(auVar69,auVar70._0_16_);
                  auVar57._0_4_ =
                       (uint)(bVar15 & 1) * auVar59._0_4_ | (uint)!(bool)(bVar15 & 1) * 0x7f800000;
                  bVar8 = (bool)(bVar15 >> 1 & 1);
                  auVar57._4_4_ = (uint)bVar8 * auVar59._4_4_ | (uint)!bVar8 * 0x7f800000;
                  bVar8 = (bool)(bVar15 >> 2 & 1);
                  auVar57._8_4_ = (uint)bVar8 * auVar59._8_4_ | (uint)!bVar8 * 0x7f800000;
                  auVar57._12_4_ =
                       (uint)(bVar15 >> 3) * auVar59._12_4_ |
                       (uint)!(bool)(bVar15 >> 3) * 0x7f800000;
                  auVar59 = vshufps_avx(auVar57,auVar57,0xb1);
                  auVar59 = vminps_avx(auVar59,auVar57);
                  auVar55 = vshufpd_avx(auVar59,auVar59,1);
                  auVar59 = vminps_avx(auVar55,auVar59);
                  uVar10 = vcmpps_avx512vl(auVar57,auVar59,0);
                  bVar19 = (byte)uVar10 & bVar15;
                } while( true );
              }
            }
          }
          local_2658 = local_2658 + 1;
        } while (local_2658 != local_2668);
      }
      uVar77 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar70 = ZEXT3264(CONCAT428(uVar77,CONCAT424(uVar77,CONCAT420(uVar77,CONCAT416(uVar77,
                                                  CONCAT412(uVar77,CONCAT48(uVar77,CONCAT44(uVar77,
                                                  uVar77))))))));
      auVar107 = ZEXT3264(local_2418);
      auVar108 = ZEXT3264(_DAT_01fe9900);
      auVar109 = ZEXT3264(CONCAT428(0xfffffff8,
                                    CONCAT424(0xfffffff8,
                                              CONCAT420(0xfffffff8,
                                                        CONCAT416(0xfffffff8,
                                                                  CONCAT412(0xfffffff8,
                                                                            CONCAT48(0xfffffff8,
                                                                                                                                                                          
                                                  0xfffffff8fffffff8)))))));
      uVar30 = local_2678;
      fVar78 = local_2398;
      fVar79 = fStack_2394;
      fVar80 = fStack_2390;
      fVar81 = fStack_238c;
      fVar82 = fStack_2388;
      fVar83 = fStack_2384;
      fVar84 = fStack_2380;
      fVar85 = local_23b8;
      fVar87 = fStack_23b4;
      fVar88 = fStack_23b0;
      fVar89 = fStack_23ac;
      fVar90 = fStack_23a8;
      fVar91 = fStack_23a4;
      fVar92 = fStack_23a0;
      fVar93 = local_23d8;
      fVar94 = fStack_23d4;
      fVar95 = fStack_23d0;
      fVar96 = fStack_23cc;
      fVar97 = fStack_23c8;
      fVar98 = fStack_23c4;
      fVar99 = fStack_23c0;
      fVar100 = local_23f8;
      fVar101 = fStack_23f4;
      fVar102 = fStack_23f0;
      fVar103 = fStack_23ec;
      fVar104 = fStack_23e8;
      fVar105 = fStack_23e4;
      fVar106 = fStack_23e0;
    }
LAB_00791f9b:
    if (local_2670 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }